

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

string * QPDF::recover_encryption_key_with_password
                   (string *__return_storage_ptr__,string *password,EncryptionData *data,
                   bool *perms_valid)

{
  bool bVar1;
  string *__return_storage_ptr___00;
  string intermediate_key;
  string key_salt;
  string user_data;
  string encrypted_file_key;
  string key_password;
  uchar k [16];
  string perms_check;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  long local_68;
  int local_60;
  string local_50;
  
  *perms_valid = false;
  std::__cxx11::string::substr((ulong)&local_88,(ulong)password);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar1 = check_owner_password_V5(&local_88,data);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_108,(ulong)&data->O);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)&data->U);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)&data->OE);
  }
  else {
    bVar1 = check_user_password_V5(&local_88,data);
    if (!bVar1) goto LAB_0020614a;
    std::__cxx11::string::substr((ulong)&local_108,(ulong)&data->U);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)&data->UE);
  }
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_0020614a:
  hash_V5(&local_108,&local_88,&local_e8,&local_c8,data);
  process_with_aes(__return_storage_ptr__,&local_108,false,&local_a8,0,1,(uchar *)0x0,0);
  __return_storage_ptr___00 = &local_50;
  process_with_aes(__return_storage_ptr___00,__return_storage_ptr__,false,&data->Perms,0xc,1,
                   (uchar *)0x0,0);
  compute_Perms_value_V5_clear(__return_storage_ptr___00,data,(uchar *)&local_68);
  *perms_valid = (int)*(long *)(local_50._M_dataplus._M_p + 8) == local_60 &&
                 *(long *)local_50._M_dataplus._M_p == local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::recover_encryption_key_with_password(
    std::string const& password, EncryptionData const& data, bool& perms_valid)
{
    // Algorithm 3.2a from the PDF 1.7 extension level 3

    // This code does not handle Unicode passwords correctly. Empirical evidence suggests that most
    // viewers don't.  We are supposed to process the input string with the SASLprep (RFC 4013)
    // profile of stringprep (RFC 3454) and then convert the result to UTF-8.

    perms_valid = false;
    std::string key_password = truncate_password_V5(password);
    std::string key_salt;
    std::string user_data;
    std::string encrypted_file_key;
    if (check_owner_password_V5(key_password, data)) {
        key_salt = data.getO().substr(40, 8);
        user_data = data.getU().substr(0, 48);
        encrypted_file_key = data.getOE().substr(0, 32);
    } else if (check_user_password_V5(key_password, data)) {
        key_salt = data.getU().substr(40, 8);
        encrypted_file_key = data.getUE().substr(0, 32);
    }
    std::string intermediate_key = hash_V5(key_password, key_salt, user_data, data);
    std::string file_key = process_with_aes(intermediate_key, false, encrypted_file_key);

    // Decrypt Perms and check against expected value
    std::string perms_check = process_with_aes(file_key, false, data.getPerms(), 12);
    unsigned char k[16];
    compute_Perms_value_V5_clear(file_key, data, k);
    perms_valid = (memcmp(perms_check.c_str(), k, 12) == 0);

    return file_key;
}